

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_utils.h
# Opt level: O0

void free_cstr_arr(char **arr,size_t sz)

{
  ulong local_20;
  size_t i;
  size_t sz_local;
  char **arr_local;
  
  if (arr != (char **)0x0) {
    if (0 < (int)sz) {
      for (local_20 = 0; local_20 < sz; local_20 = local_20 + 1) {
        free(arr[local_20]);
      }
    }
    free(arr);
  }
  return;
}

Assistant:

inline void free_cstr_arr(char **arr, size_t sz) {
    if (arr == NULL)
        return;

    if ((int)sz > 0)
        for (size_t i = 0; i < sz; i++)
            free(arr[i]);

    free(arr);
}